

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  byte bVar1;
  byte bVar2;
  GCObject *o;
  global_State *pgVar3;
  GCObject **local_48;
  int marked;
  GCObject *curr;
  int white;
  int ow;
  global_State *g;
  lu_mem count_local;
  GCObject **p_local;
  lua_State *L_local;
  
  bVar1 = L->l_G->currentwhite;
  bVar2 = L->l_G->currentwhite;
  g = (global_State *)count;
  count_local = (lu_mem)p;
  while( true ) {
    pgVar3 = g;
    if (*(long *)count_local != 0) {
      g = (global_State *)((long)g[-1].strcache[0x34] + 0xf);
    }
    if (*(long *)count_local == 0 || pgVar3 == (global_State *)0x0) break;
    o = *(GCObject **)count_local;
    if ((byte)((o->marked ^ 3) & (bVar1 ^ 3)) == 0) {
      *(GCObject **)count_local = o->next;
      freeobj(L,o);
    }
    else {
      o->marked = o->marked & 0xf8 | bVar2 & 3;
      count_local = (lu_mem)o;
    }
  }
  if (*(long *)count_local == 0) {
    local_48 = (GCObject **)0x0;
  }
  else {
    local_48 = (GCObject **)count_local;
  }
  return local_48;
}

Assistant:

static GCObject **sweeplist(lua_State *L, GCObject **p, lu_mem count) {
    global_State *g = G(L);
    int ow = otherwhite(g);
    int white = luaC_white(g);  /* current white */
    while (*p != NULL && count-- > 0) {
        GCObject *curr = *p;
        int marked = curr->marked;
        if (isdeadm(ow, marked)) {  /* is 'curr' dead? */
            *p = curr->next;  /* remove 'curr' from list */
            freeobj(L, curr);  /* erase 'curr' */
        } else {  /* change mark to 'white' */
            curr->marked = cast_byte((marked & maskcolors) | white);
            p = &curr->next;  /* go to next element */
        }
    }
    return (*p == NULL) ? NULL : p;
}